

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

int Mio_CollectRootsNewDefault3(int nInputs,Vec_Ptr_t **pvNames,Vec_Wrd_t **pvTruths)

{
  undefined8 *puVar1;
  word *pwVar2;
  int iVar3;
  Mio_Library_t *pLib_00;
  void *__ptr;
  Vec_Ptr_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  word wVar7;
  word *pTruth;
  Mio_Gate_t **ppGates;
  Mio_Gate_t *pGate0;
  int local_30;
  int nGates;
  int iGate;
  int i;
  Mio_Library_t *pLib;
  Vec_Wrd_t **pvTruths_local;
  Vec_Ptr_t **pvNames_local;
  int nInputs_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  local_30 = 0;
  if (pLib_00 == (Mio_Library_t *)0x0) {
    pvNames_local._4_4_ = 0;
  }
  else {
    pvNames_local._4_4_ = Mio_LibraryReadGateNum(pLib_00);
    __ptr = calloc((long)pvNames_local._4_4_,8);
    for (ppGates = (Mio_Gate_t **)Mio_LibraryReadGates(pLib_00); ppGates != (Mio_Gate_t **)0x0;
        ppGates = (Mio_Gate_t **)Mio_GateReadNext((Mio_Gate_t *)ppGates)) {
      *(Mio_Gate_t ***)((long)__ptr + (long)*(int *)(ppGates + 8) * 8) = ppGates;
    }
    pVVar4 = Vec_PtrAlloc(pvNames_local._4_4_);
    *pvNames = pVVar4;
    pVVar5 = Vec_WrdStart(pvNames_local._4_4_ << 2);
    *pvTruths = pVVar5;
    for (nGates = 0; nGates < pvNames_local._4_4_; nGates = nGates + 1) {
      puVar1 = *(undefined8 **)((long)__ptr + (long)nGates * 8);
      if ((*(int *)((long)puVar1 + 0x44) <= nInputs) && (puVar1[7] == 0)) {
        Vec_PtrPush(*pvNames,(void *)*puVar1);
        iVar3 = local_30 + 1;
        pwVar6 = Vec_WrdEntryP(*pvTruths,local_30 << 2);
        local_30 = iVar3;
        if (*(int *)((long)puVar1 + 0x44) < 7) {
          wVar7 = puVar1[0xd];
          pwVar6[3] = wVar7;
          pwVar6[2] = wVar7;
          pwVar6[1] = wVar7;
          *pwVar6 = wVar7;
        }
        else if (*(int *)((long)puVar1 + 0x44) == 7) {
          wVar7 = *(word *)puVar1[0xd];
          pwVar6[2] = wVar7;
          *pwVar6 = wVar7;
          wVar7 = *(word *)(puVar1[0xd] + 8);
          pwVar6[3] = wVar7;
          pwVar6[1] = wVar7;
        }
        else if (*(int *)((long)puVar1 + 0x44) == 8) {
          pwVar2 = (word *)puVar1[0xd];
          *pwVar6 = *pwVar2;
          pwVar6[1] = pwVar2[1];
          pwVar6[2] = pwVar2[2];
          pwVar6[3] = pwVar2[3];
        }
      }
    }
    if (local_30 != pvNames_local._4_4_) {
      __assert_fail("iGate == nGates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x394,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,0);
    if (wVar7 != 0) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x395,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,4);
    if (wVar7 != 0xffffffffffffffff) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 4) == ~(word)0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x396,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,8);
    if (wVar7 != s_Truths6[0]) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 8) == s_Truths6[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x397,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,0xc);
    if (wVar7 != (s_Truths6[0] ^ 0xffffffffffffffff)) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x398,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return pvNames_local._4_4_;
}

Assistant:

int Mio_CollectRootsNewDefault3( int nInputs, Vec_Ptr_t ** pvNames, Vec_Wrd_t ** pvTruths )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    int i, iGate = 0, nGates = pLib ? Mio_LibraryReadGateNum( pLib ) : 0;
    Mio_Gate_t * pGate0, ** ppGates; word * pTruth;
    if ( pLib == NULL )
        return 0;
    ppGates = ABC_CALLOC( Mio_Gate_t *, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        ppGates[pGate0->Cell] = pGate0;
    *pvNames  = Vec_PtrAlloc( nGates );
    *pvTruths = Vec_WrdStart( nGates * 4 );
    for ( i = 0; i < nGates; i++ )
    {
        pGate0 = ppGates[i];
        if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
            continue;
        Vec_PtrPush( *pvNames, pGate0->pName );
        pTruth = Vec_WrdEntryP( *pvTruths, iGate++*4 );
        if ( pGate0->nInputs <= 6 )
            pTruth[0] = pTruth[1] = pTruth[2] = pTruth[3] = pGate0->uTruth;
        else if ( pGate0->nInputs == 7 )
        {
            pTruth[0] = pTruth[2] = pGate0->pTruth[0];
            pTruth[1] = pTruth[3] = pGate0->pTruth[1];
        }
        else if ( pGate0->nInputs == 8 )
            memcpy( pTruth, pGate0->pTruth, (size_t)(4*sizeof(word)) );
    }
    assert( iGate == nGates );
    assert( Vec_WrdEntry(*pvTruths,  0) ==        0 );
    assert( Vec_WrdEntry(*pvTruths,  4) == ~(word)0 );
    assert( Vec_WrdEntry(*pvTruths,  8) ==  s_Truths6[0] );
    assert( Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0] );
    ABC_FREE( ppGates );
    return nGates;
}